

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox_p.h
# Opt level: O0

QSize __thiscall
QComboMenuDelegate::sizeHint
          (QComboMenuDelegate *this,QStyleOptionViewItem *option,QModelIndex *index)

{
  long lVar1;
  QRect *this_00;
  QSize QVar2;
  long in_RDI;
  long in_FS_OFFSET;
  QStyleOptionMenuItem opt;
  QWidget *this_01;
  QStyleOptionMenuItem *this_02;
  QSize local_b0;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
  this_02 = (QStyleOptionMenuItem *)&DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
  getStyleOption((QComboMenuDelegate *)&DAT_aaaaaaaaaaaaaaaa,
                 (QStyleOptionViewItem *)&DAT_aaaaaaaaaaaaaaaa,(QModelIndex *)&DAT_aaaaaaaaaaaaaaaa)
  ;
  this_00 = (QRect *)QWidget::style(this_01);
  local_b0 = QRect::size(this_00);
  QVar2 = (QSize)(**(code **)(*(long *)this_00 + 0xe8))
                           (this_00,7,&local_a8,&local_b0,*(undefined8 *)(in_RDI + 0x10));
  QStyleOptionMenuItem::~QStyleOptionMenuItem(this_02);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QSize sizeHint(const QStyleOptionViewItem &option,
                   const QModelIndex &index) const override {
        QStyleOptionMenuItem opt = getStyleOption(option, index);
        return mCombo->style()->sizeFromContents(
            QStyle::CT_MenuItem, &opt, option.rect.size(), mCombo);
    }